

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O0

int fffr8i4(double *input,long ntodo,double scale,double zero,int nullcheck,long nullval,
           char *nullarray,int *anynull,long *output,int *status)

{
  short sVar1;
  double dVar2;
  ushort *puStack_60;
  short iret;
  short *sptr;
  double dvalue;
  long ii;
  int *anynull_local;
  char *nullarray_local;
  long nullval_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  double *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        dVar2 = input[(long)dvalue] * scale + zero;
        if (-9.223372036854775e+18 <= dVar2) {
          if (dVar2 <= 9.223372036854775e+18) {
            output[(long)dvalue] = (long)dVar2;
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = -0x8000000000000000;
        }
      }
    }
    else {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        if (-9.223372036854775e+18 < input[(long)dvalue] ||
            input[(long)dvalue] == -9.223372036854775e+18) {
          if (input[(long)dvalue] <= 9.223372036854775e+18) {
            output[(long)dvalue] = (long)input[(long)dvalue];
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = -0x8000000000000000;
        }
      }
    }
  }
  else {
    puStack_60 = (ushort *)((long)input + 6);
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        if ((*puStack_60 & 0x7ff0) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*puStack_60 & 0x7ff0) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          dVar2 = input[(long)dvalue] * scale + zero;
          if (-9.223372036854775e+18 <= dVar2) {
            if (dVar2 <= 9.223372036854775e+18) {
              output[(long)dvalue] = (long)dVar2;
            }
            else {
              *status = -0xb;
              output[(long)dvalue] = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = -0x8000000000000000;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[(long)dvalue] = nullval;
          }
          else {
            nullarray[(long)dvalue] = '\x01';
          }
        }
        else if (-9.223372036854775e+18 <= zero) {
          if (zero <= 9.223372036854775e+18) {
            output[(long)dvalue] = (long)zero;
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = -0x8000000000000000;
        }
        puStack_60 = puStack_60 + 4;
      }
    }
    else {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        if ((*puStack_60 & 0x7ff0) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*puStack_60 & 0x7ff0) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          if (-9.223372036854775e+18 < input[(long)dvalue] ||
              input[(long)dvalue] == -9.223372036854775e+18) {
            if (input[(long)dvalue] <= 9.223372036854775e+18) {
              output[(long)dvalue] = (long)input[(long)dvalue];
            }
            else {
              *status = -0xb;
              output[(long)dvalue] = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = -0x8000000000000000;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[(long)dvalue] = nullval;
          }
          else {
            nullarray[(long)dvalue] = '\x01';
          }
        }
        else {
          output[(long)dvalue] = 0;
        }
        puStack_60 = puStack_60 + 4;
      }
    }
  }
  return *status;
}

Assistant:

int fffr8i4(double *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MIN;
                }
                else if (input[ii] > DLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MAX;
                }
                else
                    output[ii] = (long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MIN;
                }
                else if (dvalue > DLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MAX;
                }
                else
                    output[ii] = (long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (input[ii] > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  {
                    if (zero < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (zero > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (dvalue > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) dvalue;
                }
            }
        }
    }
    return(*status);
}